

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_simple_wait_frame_on_channel
              (amqp_connection_state_t state,amqp_channel_t channel,amqp_frame_t *decoded_frame)

{
  void *__src;
  int iVar1;
  amqp_connection_state_t in_RDX;
  short in_SI;
  amqp_frame_t *in_RDI;
  amqp_connection_state_t unaff_retaddr;
  amqp_time_t in_stack_00000008;
  int res;
  amqp_link_t *cur;
  amqp_frame_t *frame_ptr;
  amqp_frame_t *frame;
  amqp_connection_state_t state_00;
  undefined8 *local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  for (local_30 = (undefined8 *)in_RDI[5].payload.method.decoded; local_30 != (undefined8 *)0x0;
      local_30 = (undefined8 *)*local_30) {
    __src = (void *)local_30[1];
    if (in_SI == *(short *)((long)__src + 2)) {
      in_RDI[5].payload.method.decoded = (void *)*local_30;
      if (in_RDI[5].payload.method.decoded == (void *)0x0) {
        in_RDI[5].payload.properties.decoded = (void *)0x0;
      }
      memcpy(in_RDX,__src,0x30);
      return 0;
    }
  }
  while( true ) {
    frame = in_RDI;
    state_00 = in_RDX;
    amqp_time_infinite();
    iVar1 = wait_frame_inner(unaff_retaddr,
                             (amqp_frame_t *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_stack_00000008);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (in_SI == *(short *)((long)in_RDX->pool_table + 2)) break;
    iVar1 = amqp_queue_frame(state_00,frame);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int amqp_simple_wait_frame_on_channel(amqp_connection_state_t state,
                                      amqp_channel_t channel,
                                      amqp_frame_t *decoded_frame) {
  amqp_frame_t *frame_ptr;
  amqp_link_t *cur;
  int res;

  for (cur = state->first_queued_frame; NULL != cur; cur = cur->next) {
    frame_ptr = cur->data;

    if (channel == frame_ptr->channel) {
      state->first_queued_frame = cur->next;
      if (NULL == state->first_queued_frame) {
        state->last_queued_frame = NULL;
      }

      *decoded_frame = *frame_ptr;

      return AMQP_STATUS_OK;
    }
  }

  for (;;) {
    res = wait_frame_inner(state, decoded_frame, amqp_time_infinite());

    if (AMQP_STATUS_OK != res) {
      return res;
    }

    if (channel == decoded_frame->channel) {
      return AMQP_STATUS_OK;
    } else {
      res = amqp_queue_frame(state, decoded_frame);
      if (res != AMQP_STATUS_OK) {
        return res;
      }
    }
  }
}